

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<_3562ccc5_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
::
emplace<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>
          (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
           *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>
                 *key)

{
  EntryPointer psVar1;
  pointer __s1;
  size_t __n;
  int iVar2;
  size_t sVar3;
  long lVar4;
  EntryPointer psVar5;
  EntryPointer current_entry;
  char distance_from_desired;
  pair<_3562ccc5_> pVar6;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_31;
  
  sVar3 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_31,&key->first);
  lVar4 = (sVar3 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x30;
  current_entry = (EntryPointer)(*(long *)this + lVar4);
  if (*(char *)(*(long *)this + lVar4) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    __s1 = (key->first)._M_dataplus._M_p;
    __n = (key->first)._M_string_length;
    distance_from_desired = '\0';
    psVar5 = current_entry;
    do {
      if ((__n == (psVar5->field_1).value.first._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp(__s1,(psVar5->field_1).value.first._M_dataplus._M_p,__n), iVar2 == 0)))) {
        pVar6._8_8_ = 0;
        pVar6.first.current = psVar5;
        return pVar6;
      }
      current_entry = psVar5 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar5 + 1;
      psVar5 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar6 = emplace_new_key<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>
                    (this,distance_from_desired,current_entry,key);
  return pVar6;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }